

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  float fVar7;
  undefined4 uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  AABBNodeMB4D *node1;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  float fVar114;
  float fVar115;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar116;
  float fVar117;
  undefined1 auVar118 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar119 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  UVIdentity<4> mapUV;
  undefined1 local_a58 [16];
  long local_a40;
  ulong local_a38;
  NodeRef *local_a30;
  long local_a28;
  undefined1 (*local_a20) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  UVIdentity<4> *local_8e8;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  local_a30 = stack + 1;
  stack[0] = root;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar89 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar98 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar103 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar19 = fVar3 * 0.99999964;
  fVar20 = fVar4 * 0.99999964;
  fVar21 = fVar5 * 0.99999964;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  local_a38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar42 = local_a38 ^ 0x10;
  iVar6 = (tray->tnear).field_0.i[k];
  auVar119 = ZEXT1664(CONCAT412(iVar6,CONCAT48(iVar6,CONCAT44(iVar6,iVar6))));
  iVar6 = (tray->tfar).field_0.i[k];
  auVar124 = ZEXT1664(CONCAT412(iVar6,CONCAT48(iVar6,CONCAT44(iVar6,iVar6))));
  local_a20 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  bVar44 = true;
  do {
    sVar40 = local_a30[-1].ptr;
    local_a30 = local_a30 + -1;
    while( true ) {
      auVar46 = auVar89._0_16_;
      auVar118 = auVar119._0_16_;
      auVar90 = auVar98._0_16_;
      auVar76 = auVar103._0_16_;
      auVar70 = auVar124._0_16_;
      if ((sVar40 & 8) != 0) break;
      uVar23 = sVar40 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar45._4_4_ = uVar2;
      auVar45._0_4_ = uVar2;
      auVar45._8_4_ = uVar2;
      auVar45._12_4_ = uVar2;
      auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + local_a38),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + local_a38));
      auVar80 = vsubps_avx(auVar80,auVar46);
      auVar52._0_4_ = fVar19 * auVar80._0_4_;
      auVar52._4_4_ = fVar19 * auVar80._4_4_;
      auVar52._8_4_ = fVar19 * auVar80._8_4_;
      auVar52._12_4_ = fVar19 * auVar80._12_4_;
      auVar118 = vmaxps_avx(auVar118,auVar52);
      auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar33),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + uVar33));
      auVar80 = vsubps_avx(auVar80,auVar90);
      auVar59._0_4_ = fVar20 * auVar80._0_4_;
      auVar59._4_4_ = fVar20 * auVar80._4_4_;
      auVar59._8_4_ = fVar20 * auVar80._8_4_;
      auVar59._12_4_ = fVar20 * auVar80._12_4_;
      auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar41),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + uVar41));
      auVar80 = vsubps_avx(auVar80,auVar76);
      auVar69._0_4_ = fVar21 * auVar80._0_4_;
      auVar69._4_4_ = fVar21 * auVar80._4_4_;
      auVar69._8_4_ = fVar21 * auVar80._8_4_;
      auVar69._12_4_ = fVar21 * auVar80._12_4_;
      auVar80 = vmaxps_avx(auVar59,auVar69);
      auVar118 = vmaxps_avx(auVar118,auVar80);
      auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + uVar42),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + uVar42));
      auVar46 = vsubps_avx(auVar80,auVar46);
      auVar60._0_4_ = fVar3 * auVar46._0_4_;
      auVar60._4_4_ = fVar3 * auVar46._4_4_;
      auVar60._8_4_ = fVar3 * auVar46._8_4_;
      auVar60._12_4_ = fVar3 * auVar46._12_4_;
      auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar33 ^ 0x10)),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar33 ^ 0x10)));
      auVar46 = vminps_avx(auVar70,auVar60);
      auVar90 = vsubps_avx(auVar80,auVar90);
      auVar70._0_4_ = fVar4 * auVar90._0_4_;
      auVar70._4_4_ = fVar4 * auVar90._4_4_;
      auVar70._8_4_ = fVar4 * auVar90._8_4_;
      auVar70._12_4_ = fVar4 * auVar90._12_4_;
      auVar90 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar23 + 0x80 + (uVar41 ^ 0x10)),auVar45,
                                *(undefined1 (*) [16])(uVar23 + 0x20 + (uVar41 ^ 0x10)));
      auVar90 = vsubps_avx(auVar90,auVar76);
      auVar76._0_4_ = fVar5 * auVar90._0_4_;
      auVar76._4_4_ = fVar5 * auVar90._4_4_;
      auVar76._8_4_ = fVar5 * auVar90._8_4_;
      auVar76._12_4_ = fVar5 * auVar90._12_4_;
      auVar90 = vminps_avx(auVar70,auVar76);
      auVar46 = vminps_avx(auVar46,auVar90);
      if (((uint)sVar40 & 7) == 6) {
        auVar90 = vcmpps_avx(auVar118,auVar46,2);
        auVar46 = vcmpps_avx(*(undefined1 (*) [16])(uVar23 + 0xe0),auVar45,2);
        auVar76 = vcmpps_avx(auVar45,*(undefined1 (*) [16])(uVar23 + 0xf0),1);
        auVar46 = vandps_avx(auVar46,auVar76);
        auVar46 = vandps_avx(auVar46,auVar90);
      }
      else {
        auVar46 = vcmpps_avx(auVar118,auVar46,2);
      }
      auVar46 = vpslld_avx(auVar46,0x1f);
      uVar30 = vmovmskps_avx(auVar46);
      if (uVar30 == 0) goto LAB_0050775e;
      lVar31 = 0;
      for (uVar34 = (ulong)(byte)uVar30; (uVar34 & 1) == 0;
          uVar34 = uVar34 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      sVar40 = *(size_t *)(uVar23 + lVar31 * 8);
      uVar30 = (uVar30 & 0xff) - 1 & uVar30 & 0xff;
      uVar34 = (ulong)uVar30;
      if (uVar30 != 0) {
        local_a30->ptr = sVar40;
        lVar31 = 0;
        for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
          lVar31 = lVar31 + 1;
        }
        uVar30 = uVar30 - 1 & uVar30;
        uVar34 = (ulong)uVar30;
        bVar43 = uVar30 == 0;
        while( true ) {
          local_a30 = local_a30 + 1;
          sVar40 = *(size_t *)(uVar23 + lVar31 * 8);
          if (bVar43) break;
          local_a30->ptr = sVar40;
          lVar31 = 0;
          for (uVar25 = uVar34; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
            lVar31 = lVar31 + 1;
          }
          uVar34 = uVar34 - 1 & uVar34;
          bVar43 = uVar34 == 0;
        }
      }
    }
    local_a40 = (ulong)((uint)sVar40 & 0xf) - 8;
    if (local_a40 != 0) {
      uVar23 = sVar40 & 0xfffffffffffffff0;
      local_a28 = 0;
      do {
        lVar32 = local_a28 * 0x50;
        pSVar9 = context->scene;
        pGVar10 = (pSVar9->geometries).items[*(uint *)(uVar23 + 0x30 + lVar32)].ptr;
        fVar7 = (pGVar10->time_range).lower;
        fVar7 = pGVar10->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar7) / ((pGVar10->time_range).upper - fVar7));
        auVar80 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
        auVar80 = vminss_avx(auVar80,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
        auVar78 = vmaxss_avx(ZEXT816(0),auVar80);
        lVar24 = (long)(int)auVar78._0_4_ * 0x38;
        uVar39 = (ulong)*(uint *)(uVar23 + 4 + lVar32);
        lVar31 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar24);
        lVar24 = *(long *)(*(long *)&pGVar10[2].numPrimitives + 0x38 + lVar24);
        auVar80 = *(undefined1 (*) [16])(lVar31 + (ulong)*(uint *)(uVar23 + lVar32) * 4);
        uVar35 = (ulong)*(uint *)(uVar23 + 0x10 + lVar32);
        auVar93 = *(undefined1 (*) [16])(lVar31 + uVar35 * 4);
        uVar34 = (ulong)*(uint *)(uVar23 + 0x20 + lVar32);
        auVar49 = *(undefined1 (*) [16])(lVar31 + uVar34 * 4);
        auVar63 = *(undefined1 (*) [16])(lVar31 + uVar39 * 4);
        uVar25 = (ulong)*(uint *)(uVar23 + 0x14 + lVar32);
        auVar53 = *(undefined1 (*) [16])(lVar31 + uVar25 * 4);
        uVar26 = (ulong)*(uint *)(uVar23 + 0x24 + lVar32);
        auVar54 = *(undefined1 (*) [16])(lVar31 + uVar26 * 4);
        uVar38 = (ulong)*(uint *)(uVar23 + 8 + lVar32);
        auVar61 = *(undefined1 (*) [16])(lVar31 + uVar38 * 4);
        uVar27 = (ulong)*(uint *)(uVar23 + 0x18 + lVar32);
        auVar64 = *(undefined1 (*) [16])(lVar31 + uVar27 * 4);
        uVar36 = (ulong)*(uint *)(uVar23 + 0x28 + lVar32);
        auVar74 = *(undefined1 (*) [16])(lVar31 + uVar36 * 4);
        uVar37 = (ulong)*(uint *)(uVar23 + 0xc + lVar32);
        auVar75 = *(undefined1 (*) [16])(lVar31 + uVar37 * 4);
        uVar28 = (ulong)*(uint *)(uVar23 + 0x1c + lVar32);
        auVar56 = *(undefined1 (*) [16])(lVar31 + uVar28 * 4);
        uVar29 = (ulong)*(uint *)(uVar23 + 0x2c + lVar32);
        auVar88 = *(undefined1 (*) [16])(lVar31 + uVar29 * 4);
        auVar97 = *(undefined1 (*) [16])(lVar24 + (ulong)*(uint *)(uVar23 + lVar32) * 4);
        auVar104 = *(undefined1 (*) [16])(lVar24 + uVar35 * 4);
        fVar7 = fVar7 - auVar78._0_4_;
        auVar78 = vunpcklps_avx(auVar80,auVar61);
        auVar61 = vunpckhps_avx(auVar80,auVar61);
        auVar71 = vunpcklps_avx(auVar63,auVar75);
        auVar63 = vunpckhps_avx(auVar63,auVar75);
        auVar80 = *(undefined1 (*) [16])(lVar24 + uVar39 * 4);
        auVar47 = vunpcklps_avx(auVar61,auVar63);
        auVar48 = vunpcklps_avx(auVar78,auVar71);
        auVar61 = vunpckhps_avx(auVar78,auVar71);
        auVar75 = vunpcklps_avx(auVar93,auVar64);
        auVar63 = vunpckhps_avx(auVar93,auVar64);
        auVar64 = vunpcklps_avx(auVar53,auVar56);
        auVar53 = vunpckhps_avx(auVar53,auVar56);
        auVar93 = *(undefined1 (*) [16])(lVar24 + uVar38 * 4);
        auVar56 = vunpcklps_avx(auVar63,auVar53);
        auVar78 = vunpcklps_avx(auVar75,auVar64);
        auVar53 = vunpckhps_avx(auVar75,auVar64);
        auVar75 = vunpcklps_avx(auVar49,auVar74);
        auVar64 = vunpckhps_avx(auVar49,auVar74);
        auVar71 = vunpcklps_avx(auVar54,auVar88);
        auVar74 = vunpckhps_avx(auVar54,auVar88);
        auVar63 = *(undefined1 (*) [16])(lVar24 + uVar37 * 4);
        auVar88 = vunpcklps_avx(auVar64,auVar74);
        auVar49 = vunpcklps_avx(auVar75,auVar71);
        auVar64 = vunpckhps_avx(auVar75,auVar71);
        auVar74 = vunpcklps_avx(auVar97,auVar93);
        auVar93 = vunpckhps_avx(auVar97,auVar93);
        auVar75 = vunpcklps_avx(auVar80,auVar63);
        auVar63 = vunpckhps_avx(auVar80,auVar63);
        auVar80 = *(undefined1 (*) [16])(lVar24 + uVar27 * 4);
        auVar97 = vunpcklps_avx(auVar93,auVar63);
        auVar71 = vunpcklps_avx(auVar74,auVar75);
        auVar63 = vunpckhps_avx(auVar74,auVar75);
        auVar75 = vunpcklps_avx(auVar104,auVar80);
        auVar74 = vunpckhps_avx(auVar104,auVar80);
        auVar80 = *(undefined1 (*) [16])(lVar24 + uVar25 * 4);
        auVar93 = *(undefined1 (*) [16])(lVar24 + uVar28 * 4);
        auVar104 = vunpcklps_avx(auVar80,auVar93);
        auVar80 = vunpckhps_avx(auVar80,auVar93);
        auVar54 = vunpcklps_avx(auVar74,auVar80);
        auVar55 = vunpcklps_avx(auVar75,auVar104);
        auVar74 = vunpckhps_avx(auVar75,auVar104);
        auVar80 = *(undefined1 (*) [16])(lVar24 + uVar34 * 4);
        auVar93 = *(undefined1 (*) [16])(lVar24 + uVar36 * 4);
        auVar104 = vunpcklps_avx(auVar80,auVar93);
        auVar75 = vunpckhps_avx(auVar80,auVar93);
        auVar80 = *(undefined1 (*) [16])(lVar24 + uVar26 * 4);
        auVar93 = *(undefined1 (*) [16])(lVar24 + uVar29 * 4);
        auVar62 = vunpcklps_avx(auVar80,auVar93);
        auVar80 = vunpckhps_avx(auVar80,auVar93);
        auVar93 = vunpcklps_avx(auVar75,auVar80);
        auVar75 = vunpcklps_avx(auVar104,auVar62);
        auVar80 = vunpckhps_avx(auVar104,auVar62);
        fVar22 = 1.0 - fVar7;
        auVar110._4_4_ = fVar22;
        auVar110._0_4_ = fVar22;
        auVar110._8_4_ = fVar22;
        auVar110._12_4_ = fVar22;
        auVar104._0_4_ = fVar7 * auVar71._0_4_;
        auVar104._4_4_ = fVar7 * auVar71._4_4_;
        auVar104._8_4_ = fVar7 * auVar71._8_4_;
        auVar104._12_4_ = fVar7 * auVar71._12_4_;
        auVar104 = vfmadd231ps_fma(auVar104,auVar110,auVar48);
        auVar91._0_4_ = fVar7 * auVar63._0_4_;
        auVar91._4_4_ = fVar7 * auVar63._4_4_;
        auVar91._8_4_ = fVar7 * auVar63._8_4_;
        auVar91._12_4_ = fVar7 * auVar63._12_4_;
        auVar63 = vfmadd231ps_fma(auVar91,auVar110,auVar61);
        auVar99._0_4_ = fVar7 * auVar97._0_4_;
        auVar99._4_4_ = fVar7 * auVar97._4_4_;
        auVar99._8_4_ = fVar7 * auVar97._8_4_;
        auVar99._12_4_ = fVar7 * auVar97._12_4_;
        auVar97 = vfmadd231ps_fma(auVar99,auVar110,auVar47);
        auVar105._0_4_ = fVar7 * auVar55._0_4_;
        auVar105._4_4_ = fVar7 * auVar55._4_4_;
        auVar105._8_4_ = fVar7 * auVar55._8_4_;
        auVar105._12_4_ = fVar7 * auVar55._12_4_;
        auVar78 = vfmadd231ps_fma(auVar105,auVar110,auVar78);
        auVar77._0_4_ = fVar7 * auVar74._0_4_;
        auVar77._4_4_ = fVar7 * auVar74._4_4_;
        auVar77._8_4_ = fVar7 * auVar74._8_4_;
        auVar77._12_4_ = fVar7 * auVar74._12_4_;
        auVar74 = vfmadd231ps_fma(auVar77,auVar110,auVar53);
        puVar1 = (undefined8 *)(uVar23 + 0x30 + lVar32);
        local_928 = *puVar1;
        uStack_920 = puVar1[1];
        puVar1 = (undefined8 *)(uVar23 + 0x40 + lVar32);
        auVar53._0_4_ = fVar7 * auVar54._0_4_;
        auVar53._4_4_ = fVar7 * auVar54._4_4_;
        auVar53._8_4_ = fVar7 * auVar54._8_4_;
        auVar53._12_4_ = fVar7 * auVar54._12_4_;
        auVar56 = vfmadd231ps_fma(auVar53,auVar110,auVar56);
        auVar61._0_4_ = fVar7 * auVar75._0_4_;
        auVar61._4_4_ = fVar7 * auVar75._4_4_;
        auVar61._8_4_ = fVar7 * auVar75._8_4_;
        auVar61._12_4_ = fVar7 * auVar75._12_4_;
        auVar71._0_4_ = fVar7 * auVar80._0_4_;
        auVar71._4_4_ = fVar7 * auVar80._4_4_;
        auVar71._8_4_ = fVar7 * auVar80._8_4_;
        auVar71._12_4_ = fVar7 * auVar80._12_4_;
        auVar84._0_4_ = fVar7 * auVar93._0_4_;
        auVar84._4_4_ = fVar7 * auVar93._4_4_;
        auVar84._8_4_ = fVar7 * auVar93._8_4_;
        auVar84._12_4_ = fVar7 * auVar93._12_4_;
        auVar75 = vfmadd231ps_fma(auVar61,auVar110,auVar49);
        auVar71 = vfmadd231ps_fma(auVar71,auVar110,auVar64);
        auVar88 = vfmadd231ps_fma(auVar84,auVar110,auVar88);
        local_938 = *puVar1;
        uStack_930 = puVar1[1];
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar47._4_4_ = uVar2;
        auVar47._0_4_ = uVar2;
        auVar47._8_4_ = uVar2;
        auVar47._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar109._4_4_ = uVar2;
        auVar109._0_4_ = uVar2;
        auVar109._8_4_ = uVar2;
        auVar109._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar112._4_4_ = uVar2;
        auVar112._0_4_ = uVar2;
        auVar112._8_4_ = uVar2;
        auVar112._12_4_ = uVar2;
        auVar53 = vsubps_avx(auVar104,auVar47);
        auVar61 = vsubps_avx(auVar63,auVar109);
        auVar80 = vsubps_avx(auVar97,auVar112);
        auVar93 = vsubps_avx(auVar78,auVar47);
        auVar63 = vsubps_avx(auVar74,auVar109);
        auVar64 = vsubps_avx(auVar56,auVar112);
        auVar74 = vsubps_avx(auVar75,auVar47);
        auVar75 = vsubps_avx(auVar71,auVar109);
        auVar56 = vsubps_avx(auVar88,auVar112);
        auVar88 = vsubps_avx(auVar74,auVar53);
        auVar97 = vsubps_avx(auVar75,auVar61);
        auVar104 = vsubps_avx(auVar56,auVar80);
        auVar48._0_4_ = auVar53._0_4_ + auVar74._0_4_;
        auVar48._4_4_ = auVar53._4_4_ + auVar74._4_4_;
        auVar48._8_4_ = auVar53._8_4_ + auVar74._8_4_;
        auVar48._12_4_ = auVar53._12_4_ + auVar74._12_4_;
        auVar72._0_4_ = auVar75._0_4_ + auVar61._0_4_;
        auVar72._4_4_ = auVar75._4_4_ + auVar61._4_4_;
        auVar72._8_4_ = auVar75._8_4_ + auVar61._8_4_;
        auVar72._12_4_ = auVar75._12_4_ + auVar61._12_4_;
        fVar22 = auVar80._0_4_;
        auVar78._0_4_ = auVar56._0_4_ + fVar22;
        fVar12 = auVar80._4_4_;
        auVar78._4_4_ = auVar56._4_4_ + fVar12;
        fVar13 = auVar80._8_4_;
        auVar78._8_4_ = auVar56._8_4_ + fVar13;
        fVar14 = auVar80._12_4_;
        auVar78._12_4_ = auVar56._12_4_ + fVar14;
        auVar113._0_4_ = auVar104._0_4_ * auVar72._0_4_;
        auVar113._4_4_ = auVar104._4_4_ * auVar72._4_4_;
        auVar113._8_4_ = auVar104._8_4_ * auVar72._8_4_;
        auVar113._12_4_ = auVar104._12_4_ * auVar72._12_4_;
        auVar71 = vfmsub231ps_fma(auVar113,auVar97,auVar78);
        auVar79._0_4_ = auVar88._0_4_ * auVar78._0_4_;
        auVar79._4_4_ = auVar88._4_4_ * auVar78._4_4_;
        auVar79._8_4_ = auVar88._8_4_ * auVar78._8_4_;
        auVar79._12_4_ = auVar88._12_4_ * auVar78._12_4_;
        auVar78 = vfmsub231ps_fma(auVar79,auVar104,auVar48);
        auVar49._0_4_ = auVar97._0_4_ * auVar48._0_4_;
        auVar49._4_4_ = auVar97._4_4_ * auVar48._4_4_;
        auVar49._8_4_ = auVar97._8_4_ * auVar48._8_4_;
        auVar49._12_4_ = auVar97._12_4_ * auVar48._12_4_;
        auVar47 = vfmsub231ps_fma(auVar49,auVar88,auVar72);
        fVar7 = *(float *)(ray + k * 4 + 0x60);
        auVar73._0_4_ = fVar7 * auVar47._0_4_;
        auVar73._4_4_ = fVar7 * auVar47._4_4_;
        auVar73._8_4_ = fVar7 * auVar47._8_4_;
        auVar73._12_4_ = fVar7 * auVar47._12_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar123._4_4_ = uVar2;
        auVar123._0_4_ = uVar2;
        auVar123._8_4_ = uVar2;
        auVar123._12_4_ = uVar2;
        auVar78 = vfmadd231ps_fma(auVar73,auVar123,auVar78);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar106._4_4_ = uVar2;
        auVar106._0_4_ = uVar2;
        auVar106._8_4_ = uVar2;
        auVar106._12_4_ = uVar2;
        auVar49 = vfmadd231ps_fma(auVar78,auVar106,auVar71);
        auVar78 = vsubps_avx(auVar61,auVar63);
        auVar71 = vsubps_avx(auVar80,auVar64);
        auVar54._0_4_ = auVar61._0_4_ + auVar63._0_4_;
        auVar54._4_4_ = auVar61._4_4_ + auVar63._4_4_;
        auVar54._8_4_ = auVar61._8_4_ + auVar63._8_4_;
        auVar54._12_4_ = auVar61._12_4_ + auVar63._12_4_;
        auVar80._0_4_ = auVar64._0_4_ + fVar22;
        auVar80._4_4_ = auVar64._4_4_ + fVar12;
        auVar80._8_4_ = auVar64._8_4_ + fVar13;
        auVar80._12_4_ = auVar64._12_4_ + fVar14;
        fVar15 = auVar71._0_4_;
        auVar92._0_4_ = auVar54._0_4_ * fVar15;
        fVar16 = auVar71._4_4_;
        auVar92._4_4_ = auVar54._4_4_ * fVar16;
        fVar17 = auVar71._8_4_;
        auVar92._8_4_ = auVar54._8_4_ * fVar17;
        fVar18 = auVar71._12_4_;
        auVar92._12_4_ = auVar54._12_4_ * fVar18;
        auVar48 = vfmsub231ps_fma(auVar92,auVar78,auVar80);
        auVar47 = vsubps_avx(auVar53,auVar93);
        fVar111 = auVar47._0_4_;
        auVar100._0_4_ = fVar111 * auVar80._0_4_;
        fVar114 = auVar47._4_4_;
        auVar100._4_4_ = fVar114 * auVar80._4_4_;
        fVar115 = auVar47._8_4_;
        auVar100._8_4_ = fVar115 * auVar80._8_4_;
        fVar116 = auVar47._12_4_;
        auVar100._12_4_ = fVar116 * auVar80._12_4_;
        auVar81._0_4_ = auVar53._0_4_ + auVar93._0_4_;
        auVar81._4_4_ = auVar53._4_4_ + auVar93._4_4_;
        auVar81._8_4_ = auVar53._8_4_ + auVar93._8_4_;
        auVar81._12_4_ = auVar53._12_4_ + auVar93._12_4_;
        auVar80 = vfmsub231ps_fma(auVar100,auVar71,auVar81);
        fVar117 = auVar78._0_4_;
        auVar82._0_4_ = fVar117 * auVar81._0_4_;
        fVar120 = auVar78._4_4_;
        auVar82._4_4_ = fVar120 * auVar81._4_4_;
        fVar121 = auVar78._8_4_;
        auVar82._8_4_ = fVar121 * auVar81._8_4_;
        fVar122 = auVar78._12_4_;
        auVar82._12_4_ = fVar122 * auVar81._12_4_;
        auVar54 = vfmsub231ps_fma(auVar82,auVar47,auVar54);
        auVar83._0_4_ = fVar7 * auVar54._0_4_;
        auVar83._4_4_ = fVar7 * auVar54._4_4_;
        auVar83._8_4_ = fVar7 * auVar54._8_4_;
        auVar83._12_4_ = fVar7 * auVar54._12_4_;
        auVar80 = vfmadd231ps_fma(auVar83,auVar123,auVar80);
        local_908 = vfmadd231ps_fma(auVar80,auVar106,auVar48);
        auVar48 = vsubps_avx(auVar93,auVar74);
        auVar62._0_4_ = auVar93._0_4_ + auVar74._0_4_;
        auVar62._4_4_ = auVar93._4_4_ + auVar74._4_4_;
        auVar62._8_4_ = auVar93._8_4_ + auVar74._8_4_;
        auVar62._12_4_ = auVar93._12_4_ + auVar74._12_4_;
        auVar74 = vsubps_avx(auVar63,auVar75);
        auVar55._0_4_ = auVar75._0_4_ + auVar63._0_4_;
        auVar55._4_4_ = auVar75._4_4_ + auVar63._4_4_;
        auVar55._8_4_ = auVar75._8_4_ + auVar63._8_4_;
        auVar55._12_4_ = auVar75._12_4_ + auVar63._12_4_;
        auVar75 = vsubps_avx(auVar64,auVar56);
        auVar85._0_4_ = auVar64._0_4_ + auVar56._0_4_;
        auVar85._4_4_ = auVar64._4_4_ + auVar56._4_4_;
        auVar85._8_4_ = auVar64._8_4_ + auVar56._8_4_;
        auVar85._12_4_ = auVar64._12_4_ + auVar56._12_4_;
        auVar93._0_4_ = auVar75._0_4_ * auVar55._0_4_;
        auVar93._4_4_ = auVar75._4_4_ * auVar55._4_4_;
        auVar93._8_4_ = auVar75._8_4_ * auVar55._8_4_;
        auVar93._12_4_ = auVar75._12_4_ * auVar55._12_4_;
        auVar93 = vfmsub231ps_fma(auVar93,auVar74,auVar85);
        auVar86._0_4_ = auVar85._0_4_ * auVar48._0_4_;
        auVar86._4_4_ = auVar85._4_4_ * auVar48._4_4_;
        auVar86._8_4_ = auVar85._8_4_ * auVar48._8_4_;
        auVar86._12_4_ = auVar85._12_4_ * auVar48._12_4_;
        auVar80 = vfmsub231ps_fma(auVar86,auVar75,auVar62);
        auVar63._0_4_ = auVar74._0_4_ * auVar62._0_4_;
        auVar63._4_4_ = auVar74._4_4_ * auVar62._4_4_;
        auVar63._8_4_ = auVar74._8_4_ * auVar62._8_4_;
        auVar63._12_4_ = auVar74._12_4_ * auVar62._12_4_;
        auVar63 = vfmsub231ps_fma(auVar63,auVar48,auVar55);
        auVar64._0_4_ = fVar7 * auVar63._0_4_;
        auVar64._4_4_ = fVar7 * auVar63._4_4_;
        auVar64._8_4_ = fVar7 * auVar63._8_4_;
        auVar64._12_4_ = fVar7 * auVar63._12_4_;
        auVar80 = vfmadd231ps_fma(auVar64,auVar123,auVar80);
        auVar64 = vfmadd231ps_fma(auVar80,auVar106,auVar93);
        local_918 = auVar49._0_4_;
        fStack_914 = auVar49._4_4_;
        fStack_910 = auVar49._8_4_;
        fStack_90c = auVar49._12_4_;
        local_8f8._0_4_ = auVar64._0_4_ + local_918 + local_908._0_4_;
        local_8f8._4_4_ = auVar64._4_4_ + fStack_914 + local_908._4_4_;
        local_8f8._8_4_ = auVar64._8_4_ + fStack_910 + local_908._8_4_;
        local_8f8._12_4_ = auVar64._12_4_ + fStack_90c + local_908._12_4_;
        auVar56._8_4_ = 0x7fffffff;
        auVar56._0_8_ = 0x7fffffff7fffffff;
        auVar56._12_4_ = 0x7fffffff;
        auVar80 = vminps_avx(auVar49,local_908);
        auVar93 = vminps_avx(auVar80,auVar64);
        auVar80 = vandps_avx(local_8f8,auVar56);
        auVar101._0_4_ = auVar80._0_4_ * 1.1920929e-07;
        auVar101._4_4_ = auVar80._4_4_ * 1.1920929e-07;
        auVar101._8_4_ = auVar80._8_4_ * 1.1920929e-07;
        auVar101._12_4_ = auVar80._12_4_ * 1.1920929e-07;
        uVar34 = CONCAT44(auVar101._4_4_,auVar101._0_4_);
        auVar94._0_8_ = uVar34 ^ 0x8000000080000000;
        auVar94._8_4_ = -auVar101._8_4_;
        auVar94._12_4_ = -auVar101._12_4_;
        auVar93 = vcmpps_avx(auVar93,auVar94,5);
        auVar63 = vmaxps_avx(auVar49,local_908);
        auVar63 = vmaxps_avx(auVar63,auVar64);
        auVar63 = vcmpps_avx(auVar63,auVar101,2);
        auVar93 = vorps_avx(auVar93,auVar63);
        if ((((auVar93 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar93 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar93 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar93[0xf] < '\0') {
          auVar65._0_4_ = fVar117 * auVar104._0_4_;
          auVar65._4_4_ = fVar120 * auVar104._4_4_;
          auVar65._8_4_ = fVar121 * auVar104._8_4_;
          auVar65._12_4_ = fVar122 * auVar104._12_4_;
          auVar87._0_4_ = auVar97._0_4_ * fVar111;
          auVar87._4_4_ = auVar97._4_4_ * fVar114;
          auVar87._8_4_ = auVar97._8_4_ * fVar115;
          auVar87._12_4_ = auVar97._12_4_ * fVar116;
          auVar97 = vfmsub213ps_fma(auVar97,auVar71,auVar65);
          auVar95._0_4_ = auVar74._0_4_ * fVar15;
          auVar95._4_4_ = auVar74._4_4_ * fVar16;
          auVar95._8_4_ = auVar74._8_4_ * fVar17;
          auVar95._12_4_ = auVar74._12_4_ * fVar18;
          auVar102._0_4_ = auVar75._0_4_ * fVar111;
          auVar102._4_4_ = auVar75._4_4_ * fVar114;
          auVar102._8_4_ = auVar75._8_4_ * fVar115;
          auVar102._12_4_ = auVar75._12_4_ * fVar116;
          auVar75 = vfmsub213ps_fma(auVar75,auVar78,auVar95);
          auVar63 = vandps_avx(auVar65,auVar56);
          auVar64 = vandps_avx(auVar95,auVar56);
          auVar63 = vcmpps_avx(auVar63,auVar64,1);
          local_898 = vblendvps_avx(auVar75,auVar97,auVar63);
          auVar96._0_4_ = fVar117 * auVar48._0_4_;
          auVar96._4_4_ = fVar120 * auVar48._4_4_;
          auVar96._8_4_ = fVar121 * auVar48._8_4_;
          auVar96._12_4_ = fVar122 * auVar48._12_4_;
          auVar75 = vfmsub213ps_fma(auVar48,auVar71,auVar102);
          auVar66._0_4_ = auVar88._0_4_ * fVar15;
          auVar66._4_4_ = auVar88._4_4_ * fVar16;
          auVar66._8_4_ = auVar88._8_4_ * fVar17;
          auVar66._12_4_ = auVar88._12_4_ * fVar18;
          auVar97 = vfmsub213ps_fma(auVar104,auVar47,auVar66);
          auVar63 = vandps_avx(auVar66,auVar56);
          auVar64 = vandps_avx(auVar102,auVar56);
          auVar63 = vcmpps_avx(auVar63,auVar64,1);
          local_888 = vblendvps_avx(auVar75,auVar97,auVar63);
          auVar75 = vfmsub213ps_fma(auVar88,auVar78,auVar87);
          auVar74 = vfmsub213ps_fma(auVar74,auVar47,auVar96);
          auVar63 = vandps_avx(auVar87,auVar56);
          auVar64 = vandps_avx(auVar96,auVar56);
          auVar63 = vcmpps_avx(auVar63,auVar64,1);
          local_878 = vblendvps_avx(auVar74,auVar75,auVar63);
          auVar74._0_4_ = local_878._0_4_ * fVar7;
          auVar74._4_4_ = local_878._4_4_ * fVar7;
          auVar74._8_4_ = local_878._8_4_ * fVar7;
          auVar74._12_4_ = local_878._12_4_ * fVar7;
          auVar63 = vfmadd213ps_fma(auVar123,local_888,auVar74);
          auVar63 = vfmadd213ps_fma(auVar106,local_898,auVar63);
          auVar88._0_4_ = auVar63._0_4_ + auVar63._0_4_;
          auVar88._4_4_ = auVar63._4_4_ + auVar63._4_4_;
          auVar88._8_4_ = auVar63._8_4_ + auVar63._8_4_;
          auVar88._12_4_ = auVar63._12_4_ + auVar63._12_4_;
          auVar75._0_4_ = local_878._0_4_ * fVar22;
          auVar75._4_4_ = local_878._4_4_ * fVar12;
          auVar75._8_4_ = local_878._8_4_ * fVar13;
          auVar75._12_4_ = local_878._12_4_ * fVar14;
          auVar63 = vfmadd213ps_fma(auVar61,local_888,auVar75);
          auVar53 = vfmadd213ps_fma(auVar53,local_898,auVar63);
          auVar63 = vrcpps_avx(auVar88);
          auVar107._8_4_ = 0x3f800000;
          auVar107._0_8_ = 0x3f8000003f800000;
          auVar107._12_4_ = 0x3f800000;
          auVar61 = vfnmadd213ps_fma(auVar63,auVar88,auVar107);
          auVar63 = vfmadd132ps_fma(auVar61,auVar63,auVar63);
          local_8a8._0_4_ = (auVar53._0_4_ + auVar53._0_4_) * auVar63._0_4_;
          local_8a8._4_4_ = (auVar53._4_4_ + auVar53._4_4_) * auVar63._4_4_;
          local_8a8._8_4_ = (auVar53._8_4_ + auVar53._8_4_) * auVar63._8_4_;
          local_8a8._12_4_ = (auVar53._12_4_ + auVar53._12_4_) * auVar63._12_4_;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar97._4_4_ = uVar2;
          auVar97._0_4_ = uVar2;
          auVar97._8_4_ = uVar2;
          auVar97._12_4_ = uVar2;
          auVar63 = vcmpps_avx(auVar97,local_8a8,2);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar108._4_4_ = uVar2;
          auVar108._0_4_ = uVar2;
          auVar108._8_4_ = uVar2;
          auVar108._12_4_ = uVar2;
          auVar89 = ZEXT1664(auVar108);
          auVar53 = vcmpps_avx(local_8a8,auVar108,2);
          auVar63 = vandps_avx(auVar63,auVar53);
          auVar53 = auVar93 & auVar63;
          if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar53[0xf] < '\0') {
            auVar93 = vandps_avx(auVar63,auVar93);
            auVar63 = vcmpps_avx(auVar88,_DAT_01f7aa10,4);
            local_8d8 = vandps_avx(auVar93,auVar63);
            uVar30 = vmovmskps_avx(local_8d8);
            if (uVar30 != 0) {
              local_8e8 = &mapUV;
              auVar93 = vrcpps_avx(local_8f8);
              auVar67._8_4_ = 0x3f800000;
              auVar67._0_8_ = 0x3f8000003f800000;
              auVar67._12_4_ = 0x3f800000;
              auVar63 = vfnmadd213ps_fma(local_8f8,auVar93,auVar67);
              auVar93 = vfmadd132ps_fma(auVar63,auVar93,auVar93);
              auVar57._8_4_ = 0x219392ef;
              auVar57._0_8_ = 0x219392ef219392ef;
              auVar57._12_4_ = 0x219392ef;
              auVar80 = vcmpps_avx(auVar80,auVar57,5);
              auVar80 = vandps_avx(auVar93,auVar80);
              auVar50._0_4_ = local_918 * auVar80._0_4_;
              auVar50._4_4_ = fStack_914 * auVar80._4_4_;
              auVar50._8_4_ = fStack_910 * auVar80._8_4_;
              auVar50._12_4_ = fStack_90c * auVar80._12_4_;
              local_8c8 = vminps_avx(auVar50,auVar67);
              auVar51._0_4_ = auVar80._0_4_ * local_908._0_4_;
              auVar51._4_4_ = auVar80._4_4_ * local_908._4_4_;
              auVar51._8_4_ = auVar80._8_4_ * local_908._8_4_;
              auVar51._12_4_ = auVar80._12_4_ * local_908._12_4_;
              local_8b8 = vminps_avx(auVar51,auVar67);
              uVar34 = (ulong)(uVar30 & 0xff);
              do {
                uVar25 = 0;
                for (uVar26 = uVar34; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
                {
                  uVar25 = uVar25 + 1;
                }
                uVar30 = *(uint *)((long)&local_928 + uVar25 * 4);
                pGVar10 = (pSVar9->geometries).items[uVar30].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00507774:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar44;
                  }
                  uVar26 = (ulong)(uint)((int)uVar25 * 4);
                  local_838 = *(undefined4 *)(local_8c8 + uVar26);
                  uVar2 = *(undefined4 *)(local_8b8 + uVar26);
                  local_828._4_4_ = uVar2;
                  local_828._0_4_ = uVar2;
                  local_828._8_4_ = uVar2;
                  local_828._12_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar26);
                  args.context = context->user;
                  local_808._4_4_ = uVar30;
                  local_808._0_4_ = uVar30;
                  local_808._8_4_ = uVar30;
                  local_808._12_4_ = uVar30;
                  uVar2 = *(undefined4 *)((long)&local_938 + uVar26);
                  local_818._4_4_ = uVar2;
                  local_818._0_4_ = uVar2;
                  local_818._8_4_ = uVar2;
                  local_818._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_898 + uVar26);
                  uVar8 = *(undefined4 *)(local_888 + uVar26);
                  local_858._4_4_ = uVar8;
                  local_858._0_4_ = uVar8;
                  local_858._8_4_ = uVar8;
                  local_858._12_4_ = uVar8;
                  uVar8 = *(undefined4 *)(local_878 + uVar26);
                  local_848._4_4_ = uVar8;
                  local_848._0_4_ = uVar8;
                  local_848._8_4_ = uVar8;
                  local_848._12_4_ = uVar8;
                  local_868[0] = (RTCHitN)(char)uVar2;
                  local_868[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_868[4] = (RTCHitN)(char)uVar2;
                  local_868[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_868[8] = (RTCHitN)(char)uVar2;
                  local_868[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_868[0xc] = (RTCHitN)(char)uVar2;
                  local_868[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_868[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_868[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
                  uStack_7f4 = (args.context)->instID[0];
                  local_7f8 = uStack_7f4;
                  uStack_7f0 = uStack_7f4;
                  uStack_7ec = uStack_7f4;
                  uStack_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = uStack_7e8;
                  uStack_7e0 = uStack_7e8;
                  uStack_7dc = uStack_7e8;
                  local_a58 = *local_a20;
                  args.valid = (int *)local_a58;
                  args.geometryUserPtr = pGVar10->userPtr;
                  args.hit = local_868;
                  args.N = 4;
                  auVar80 = auVar89._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&args);
                    auVar89 = ZEXT1664(auVar80);
                  }
                  if (local_a58 == (undefined1  [16])0x0) {
                    auVar80 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar80 = auVar80 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&args);
                      auVar89 = ZEXT1664(auVar80);
                    }
                    auVar93 = vpcmpeqd_avx(local_a58,_DAT_01f7aa10);
                    auVar80 = auVar93 ^ _DAT_01f7ae20;
                    auVar68._8_4_ = 0xff800000;
                    auVar68._0_8_ = 0xff800000ff800000;
                    auVar68._12_4_ = 0xff800000;
                    auVar93 = vblendvps_avx(auVar68,*(undefined1 (*) [16])(args.ray + 0x80),auVar93)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar93;
                  }
                  auVar58._8_8_ = 0x100000001;
                  auVar58._0_8_ = 0x100000001;
                  if ((auVar58 & auVar80) != (undefined1  [16])0x0) goto LAB_00507774;
                  *(int *)(ray + k * 4 + 0x80) = auVar89._0_4_;
                }
                uVar34 = uVar34 ^ 1L << (uVar25 & 0x3f);
              } while (uVar34 != 0);
            }
          }
        }
        local_a28 = local_a28 + 1;
        auVar89 = ZEXT1664(auVar46);
        auVar98 = ZEXT1664(auVar90);
        auVar103 = ZEXT1664(auVar76);
        auVar119 = ZEXT1664(auVar118);
        auVar124 = ZEXT1664(auVar70);
      } while (local_a28 != local_a40);
    }
LAB_0050775e:
    bVar44 = local_a30 != stack;
    if (!bVar44) {
      return bVar44;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }